

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QPDFWriter.cc
# Opt level: O2

void __thiscall
QPDFWriter::writeObjectStreamOffsets
          (QPDFWriter *this,vector<long_long,_std::allocator<long_long>_> *offsets,int first_obj)

{
  longlong *plVar1;
  bool bVar2;
  longlong *plVar3;
  string_view str;
  string_view str_00;
  string_view str_01;
  string_view str_02;
  string_view str_03;
  string local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> id;
  
  if (0 < first_obj) {
    std::__cxx11::to_string(&local_70,first_obj);
    std::operator+(&id,&local_70,' ');
    std::__cxx11::string::~string((string *)&local_70);
    plVar1 = (offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
             super__Vector_impl_data._M_finish;
    bVar2 = true;
    for (plVar3 = (offsets->super__Vector_base<long_long,_std::allocator<long_long>_>)._M_impl.
                  super__Vector_impl_data._M_start; plVar3 != plVar1; plVar3 = plVar3 + 1) {
      if (!bVar2) {
        str._M_str = "\n";
        str._M_len = 1;
        writeStringQDF(this,str);
        str_00._M_str = " ";
        str_00._M_len = 1;
        writeStringNoQDF(this,str_00);
      }
      str_01._M_str = id._M_dataplus._M_p;
      str_01._M_len = id._M_string_length;
      writeString(this,str_01);
      ::qpdf::util::increment(&id,1);
      std::__cxx11::to_string(&local_70,*plVar3);
      str_02._M_str = local_70._M_dataplus._M_p;
      str_02._M_len = local_70._M_string_length;
      writeString(this,str_02);
      std::__cxx11::string::~string((string *)&local_70);
      bVar2 = false;
    }
    str_03._M_str = "\n";
    str_03._M_len = 1;
    writeString(this,str_03);
    std::__cxx11::string::~string((string *)&id);
    return;
  }
  __assert_fail("first_obj > 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/jberkenbilt[P]qpdf/libqpdf/QPDFWriter.cc"
                ,0x65c,
                "void QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t> &, int)");
}

Assistant:

void
QPDFWriter::writeObjectStreamOffsets(std::vector<qpdf_offset_t>& offsets, int first_obj)
{
    qpdf_assert_debug(first_obj > 0);
    bool is_first = true;
    auto id = std::to_string(first_obj) + ' ';
    for (auto& offset: offsets) {
        if (is_first) {
            is_first = false;
        } else {
            writeStringQDF("\n");
            writeStringNoQDF(" ");
        }
        writeString(id);
        util::increment(id, 1);
        writeString(std::to_string(offset));
    }
    writeString("\n");
}